

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaParser.cpp
# Opt level: O0

void __thiscall Assimp::ColladaParser::ReadEffectLibrary(ColladaParser *this)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  mapped_type *pmVar4;
  undefined4 extraout_var_00;
  allocator local_439;
  string local_438;
  Effect local_418;
  allocator local_39;
  undefined1 local_38 [8];
  string id;
  int attrID;
  ColladaParser *this_local;
  
  uVar2 = (*this->mReader->_vptr_IIrrXMLReader[0xf])();
  if ((uVar2 & 1) == 0) {
    do {
      while( true ) {
        uVar2 = (*this->mReader->_vptr_IIrrXMLReader[2])();
        if ((uVar2 & 1) == 0) {
          return;
        }
        iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
        if (iVar3 != 1) break;
        bVar1 = IsElement(this,"effect");
        if (bVar1) {
          id.field_2._12_4_ = GetAttribute(this,"id");
          iVar3 = (*this->mReader->_vptr_IIrrXMLReader[6])
                            (this->mReader,(ulong)(uint)id.field_2._12_4_);
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_38,(char *)CONCAT44(extraout_var,iVar3),&local_39);
          std::allocator<char>::~allocator((allocator<char> *)&local_39);
          Collada::Effect::Effect(&local_418);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>_>
                   ::operator[](&this->mEffectLibrary,(key_type *)local_38);
          Collada::Effect::operator=(pmVar4,&local_418);
          Collada::Effect::~Effect(&local_418);
          pmVar4 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Assimp::Collada::Effect>_>_>
                   ::operator[](&this->mEffectLibrary,(key_type *)local_38);
          ReadEffect(this,pmVar4);
          std::__cxx11::string::~string((string *)local_38);
        }
        else {
          SkipElement(this);
        }
      }
      iVar3 = (*this->mReader->_vptr_IIrrXMLReader[3])();
    } while (iVar3 != 2);
    iVar3 = (*this->mReader->_vptr_IIrrXMLReader[0xd])();
    iVar3 = strcmp((char *)CONCAT44(extraout_var_00,iVar3),"library_effects");
    if (iVar3 != 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&local_438,"Expected end of <library_effects> element.",&local_439);
      ThrowException(this,&local_438);
    }
  }
  return;
}

Assistant:

void ColladaParser::ReadEffectLibrary()
{
    if (mReader->isEmptyElement()) {
        return;
    }

    while (mReader->read())
    {
        if (mReader->getNodeType() == irr::io::EXN_ELEMENT) {
            if (IsElement("effect"))
            {
                // read ID. Do I have to repeat my ranting about "optional" attributes?
                int attrID = GetAttribute("id");
                std::string id = mReader->getAttributeValue(attrID);

                // create an entry and store it in the library under its ID
                mEffectLibrary[id] = Effect();
                // read on from there
                ReadEffect(mEffectLibrary[id]);
            }
            else
            {
                // ignore the rest
                SkipElement();
            }
        }
        else if (mReader->getNodeType() == irr::io::EXN_ELEMENT_END) {
            if (strcmp(mReader->getNodeName(), "library_effects") != 0)
                ThrowException("Expected end of <library_effects> element.");

            break;
        }
    }
}